

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  bool bVar1;
  QSortFilterProxyModel *pQVar2;
  QSortFilterProxyModelPrivate *in_RSI;
  QSortFilterProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *parent;
  QList<QPersistentModelIndex> *__range1;
  QSortFilterProxyModel *q;
  QModelIndex mappedParent;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndex *in_stack_ffffffffffffff08;
  QModelIndex *in_stack_ffffffffffffff10;
  QList<QPersistentModelIndex> *in_stack_ffffffffffffff18;
  LayoutChangeHint _t2;
  QPersistentModelIndex *in_stack_ffffffffffffff20;
  QPersistentModelIndex local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28;
  QPersistentModelIndex *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear
            ((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)in_stack_ffffffffffffff10);
  QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_ffffffffffffff10);
  local_10.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QPersistentModelIndex>::begin
                       ((QList<QPersistentModelIndex> *)in_stack_ffffffffffffff10);
  local_18.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QPersistentModelIndex>::end
                       ((QList<QPersistentModelIndex> *)in_stack_ffffffffffffff10);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_10,local_18);
    _t2 = (LayoutChangeHint)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (!bVar1) break;
    QList<QPersistentModelIndex>::const_iterator::operator*(&local_10);
    bVar1 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_ffffffffffffff10);
    if (bVar1) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_ffffffffffffff20);
      (*(pQVar2->super_QAbstractProxyModel).super_QAbstractItemModel.super_QObject._vptr_QObject
        [0x33])(&local_40,pQVar2,local_58);
      bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff10);
      if (bVar1) {
        in_stack_ffffffffffffff18 = &in_RDI->saved_layoutChange_parents;
        in_stack_ffffffffffffff20 = &local_60;
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        QList<QPersistentModelIndex>::operator<<
                  ((QList<QPersistentModelIndex> *)in_stack_ffffffffffffff10,
                   (rvalue_ref)in_stack_ffffffffffffff08);
        QPersistentModelIndex::~QPersistentModelIndex
                  ((QPersistentModelIndex *)in_stack_ffffffffffffff10);
      }
    }
    else {
      QPersistentModelIndex::QPersistentModelIndex(&local_28);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)in_stack_ffffffffffffff10,
                 (rvalue_ref)in_stack_ffffffffffffff08);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_ffffffffffffff10);
    }
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_10);
  }
  bVar1 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x8740e7);
  if ((bVar1) ||
     (bVar1 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x8740fc),
     !bVar1)) {
    QAbstractItemModel::layoutAboutToBeChanged
              ((QAbstractItemModel *)in_stack_ffffffffffffff10,
               (QList<QPersistentModelIndex> *)in_stack_ffffffffffffff08,_t2);
    bVar1 = QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::isEmpty
                      (&(in_RDI->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
                        persistent.indexes);
    if (!bVar1) {
      store_persistent_indexes(in_RSI);
      QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::operator=
                ((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)in_stack_ffffffffffffff10,
                 (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)in_stack_ffffffffffffff08)
      ;
      QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::~QList
                ((QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x87416d);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutAboutToBeChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns
    saved_persistent_indexes.clear();

    saved_layoutChange_parents.clear();
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            saved_layoutChange_parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        // Might be filtered out.
        if (mappedParent.isValid())
            saved_layoutChange_parents << mappedParent;
    }

    // All parents filtered out.
    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    emit q->layoutAboutToBeChanged(saved_layoutChange_parents);
    if (persistent.indexes.isEmpty())
        return;

    saved_persistent_indexes = store_persistent_indexes();
}